

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O1

int mp_abs(mp_int *a,mp_int *b)

{
  int iVar1;
  
  if ((a != b) && (iVar1 = mp_copy(a,b), iVar1 != 0)) {
    return iVar1;
  }
  b->sign = 0;
  return 0;
}

Assistant:

int mp_abs (mp_int * a, mp_int * b)
{
  int     res;

  /* copy a to b */
  if (a != b) {
     if ((res = mp_copy (a, b)) != MP_OKAY) {
       return res;
     }
  }

  /* force the sign of b to positive */
  b->sign = MP_ZPOS;

  return MP_OKAY;
}